

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_forward(mg_connection *c,char *addr)

{
  void **user_data;
  byte *pbVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ns_connection *conn;
  char *__s1;
  long lVar5;
  char **ppcVar6;
  
  user_data = &c[-1].callback_param;
  conn = ns_connect((ns_mgr *)c[1].request_method,addr,mg_ev_handler,user_data);
  if (conn == (ns_connection *)0x0) {
    *(uint *)((long)*user_data + 0x98) = *(uint *)((long)*user_data + 0x98) | 0x10;
    iVar4 = 0;
  }
  else {
    pbVar1 = (byte *)((long)&conn->flags + 2);
    *pbVar1 = *pbVar1 | 0x80;
    *(undefined4 *)&c[1].http_version = 6;
    c[1].uri = (char *)conn;
    pcVar2 = c->request_method;
    iVar4 = strcmp(pcVar2,"CONNECT");
    if (iVar4 == 0) {
      send(*(int *)((long)*user_data + 0x20),"HTTP/1.1 200 OK\r\n\r\n",0x13,0);
    }
    else {
      __s1 = c->uri;
      iVar4 = bcmp(__s1,"http://",7);
      if (iVar4 != 0) goto LAB_00107524;
      __s1 = __s1 + 7;
      while( true ) {
        c->uri = __s1;
LAB_00107524:
        if ((*__s1 == '\0') || (*__s1 == '/')) break;
        __s1 = __s1 + 1;
      }
      ns_printf(conn,"%s %s HTTP/%s\r\n",pcVar2,__s1,c->http_version);
      ppcVar6 = &c->http_headers[0].value;
      bVar3 = false;
      for (lVar5 = 0; lVar5 < c->num_headers; lVar5 = lVar5 + 1) {
        pcVar2 = ((mg_header *)(ppcVar6 + -1))->name;
        iVar4 = mg_strcasecmp(pcVar2,"Connection");
        if (iVar4 == 0) {
          ns_printf(conn,"%s: %s\r\n","Connection","close");
          bVar3 = true;
        }
        else {
          ns_printf(conn,"%s: %s\r\n",pcVar2,*ppcVar6);
        }
        ppcVar6 = ppcVar6 + 2;
      }
      if (!bVar3) {
        ns_printf(conn,"%s: %s\r\n","Connection","close");
      }
      ns_printf(conn,"%s","\r\n");
      ns_send(conn,c->content,(int)c->content_len);
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int mg_forward(struct mg_connection *c, const char *addr) {
  static const char ok[] = "HTTP/1.1 200 OK\r\n\r\n";
  struct connection *conn = MG_CONN_2_CONN(c);
  struct ns_connection *pc;

  if ((pc = ns_connect(&conn->server->ns_mgr, addr,
      mg_ev_handler, conn)) == NULL) {
    conn->ns_conn->flags |= NSF_CLOSE_IMMEDIATELY;
    return 0;
  }

  // Interlink two connections
  pc->flags |= MG_PROXY_CONN;
  conn->endpoint_type = EP_PROXY;
  conn->endpoint.nc = pc;
  DBG(("%p [%s] [%s] -> %p %p", conn, c->uri, addr, pc, conn->ns_conn->ssl));

  if (strcmp(c->request_method, "CONNECT") == 0) {
    // For CONNECT request, reply with 200 OK. Tunnel is established.
    // TODO(lsm): check for send() failure
    (void) send(conn->ns_conn->sock, ok, sizeof(ok) - 1, 0);
  } else {
    // Strip "http://host:port" part from the URI
    if (memcmp(c->uri, "http://", 7) == 0) c->uri += 7;
    while (*c->uri != '\0' && *c->uri != '/') c->uri++;
    proxy_request(pc, c);
  }
  return 1;
}